

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# zvgtweak.c
# Opt level: O0

int main(int argc,char **argv)

{
  int iVar1;
  int local_30;
  int local_2c;
  int clearCount;
  int o_pIdx;
  int pIdx;
  int cc;
  uint paramsChanged;
  uint err;
  char **argv_local;
  int argc_local;
  
  iVar1 = zvgFrameOpen();
  if (iVar1 != 0) {
    zvgError(iVar1);
    exitProg();
  }
  zvgBanner(&ZvgSpeeds,&ZvgID);
  fputs("\n\nPress any key to continue...",_stdout);
  fflush(_stdout);
  fgetc(_stdin);
  init_zvgtweak();
  wattrset(_stdscr,0x100);
  initscr();
  displayMenu();
  paramRead();
  pParamAll(-1);
  tmrSetFrameRate(0x3c);
  clearCount = 0;
  local_2c = -1;
  cc = 0;
  while (cc == 0) {
    drawDisplay();
    if (local_2c != clearCount) {
      pParam(Param + clearCount,0x200,' ',' ');
      if (local_2c != -1) {
        pParam(Param + local_2c,0x100,' ',' ');
      }
      local_2c = clearCount;
    }
    if ((0 < local_30) && (local_30 = local_30 + -1, local_30 == 0)) {
      wmove(_stdscr,0x18,1);
      wclrtoeol(_stdscr);
    }
    iVar1 = wgetch(_stdscr);
    if (iVar1 != -1) {
      if (iVar1 == 0x49) {
LAB_00103244:
        zvgDmaPutc(0xed);
        pMsg(" Monitor values initialized to factory defaults. ");
        local_30 = 0xf0;
        pIdx = 1;
      }
      else if (iVar1 == 0x4c) {
LAB_0010320a:
        zvgDmaPutc(0xeb);
        pMsg(" Monitor values re-loaded from EEPROM. ");
        wattrset(_stdscr,0x100);
        local_30 = 0xf0;
        pIdx = 1;
      }
      else if (iVar1 == 0x53) {
LAB_001031eb:
        zvgDmaPutc(0xea);
        pMsg(" Current values saved to EEPROM. ");
        local_30 = 0xf0;
      }
      else {
        if (iVar1 == 0x69) goto LAB_00103244;
        if (iVar1 == 0x6c) goto LAB_0010320a;
        if (iVar1 == 0x73) goto LAB_001031eb;
        if (iVar1 == 0x102) {
          if ((uint)clearCount < 7) {
            clearCount = clearCount + 1;
          }
        }
        else if (iVar1 == 0x103) {
          if (0 < clearCount) {
            clearCount = clearCount + -1;
          }
        }
        else if (iVar1 == 0x104) {
          if (0 < Param[clearCount].value) {
            Param[clearCount].value = Param[clearCount].value + -1;
            paramSync();
            local_2c = -1;
          }
        }
        else if ((iVar1 == 0x105) && (Param[clearCount].value < 0xff)) {
          Param[clearCount].value = Param[clearCount].value + 1;
          paramSync();
          local_2c = -1;
        }
      }
      if (((iVar1 == 0x1b) || (iVar1 == 0x58)) || (iVar1 == 0x78)) break;
    }
    tmrWaitForFrame();
    cc = zvgFrameSend();
    if (pIdx != 0) {
      zvgReadMonitorInfo(&ZvgMon);
      paramRead();
      pParamAll(clearCount);
      pIdx = 0;
    }
  }
  zvgFrameClose();
  initscr();
  if (cc != 0) {
    zvgError(cc);
  }
  exitProg();
  return 0;
}

Assistant:

int main( int argc, char *argv[])
{
	uint	err;
	uint	paramsChanged;
	int	cc;
	int	pIdx, o_pIdx, clearCount;

	// Setup the ZVG subsytem, this routine initializes the timers and calibrates any timing
	// needed by the the zvgPort routines.

	err = zvgFrameOpen();

	if (err)
	{	zvgError( err);
		exitProg();
	}

	zvgBanner( ZvgSpeeds, &ZvgID);

	fputs( "\n\nPress any key to continue...", stdout);
	fflush( stdout);

#if defined(WIN32)
#elif defined(linux)

	fgetc( stdin);
	init_zvgtweak();

#else // DOS

	getch();

#endif // OS

	// setup the default screen colors, clear screen and turn off cursor

	textattr( ATTR_DEF);
#if defined(WIN32)
#elif defined(linux)

	initscr();
//!!!	_setcursortype( _NOCURSOR);

#else // DOS

	clrscr();
	_setcursortype( _NOCURSOR);

#endif // OS

	displayMenu();

	err = errOk;

	paramRead();							// move ZVG variables into local variables
	pParamAll( -1);

	// Dump frame over and over to the ZVG while looking for key presses

	tmrSetFrameRate( FRAMERATE);		// set frame rate

	pIdx = 0;
	o_pIdx = -1;
	err = errOk;

	while (err == errOk)
	{
		drawDisplay();

		// if parameter pointer has moved, clear old value and highlight new value

		if (o_pIdx != pIdx)
		{	pParam( Param + pIdx, ATTR_SEL, ' ', ' ');

			// if old index was valid, clear it, otherwise do nothing

			if (o_pIdx != -1)
				pParam( Param + o_pIdx, ATTR_DEF, ' ', ' ');

			o_pIdx = pIdx;
		}

		// check to see if informative message has timed out

		if (clearCount > 0)
		{	clearCount--;

			if (clearCount == 0)
			{	gotoxy( 1, 24);
				clreol();
			}
		}

		// check for a keypress

#if defined(WIN32)
#elif defined(linux)
		// Remember we're in a nodelay state; getch returns immediately.
		cc = getch();
		if (cc != ERR)	// Had a key press?
#else // DOS
		if (kbhit())
#endif // OS
		{
			// read key

#if defined(WIN32)
#elif defined(linux)
#else // DOS
			cc = getkey();
#endif // OS

			switch (cc)
			{
			case K_Right:
				if (Param[pIdx].value < 255)
				{	Param[pIdx].value++;
					paramSync();
					o_pIdx = -1;					// cause value to be updated
				}
				break;

			case K_Left:
				if (Param[pIdx].value > 0)
				{	Param[pIdx].value--;
					paramSync();
					o_pIdx = -1;					// cause value to be updated
				}
				break;

			case K_Down:
				if (pIdx < (sizeof( Param) / sizeof( *Param)) - 1)
					pIdx++;

				break;

			case K_Up:
				if (pIdx > 0)
					pIdx--;

				break;

				// Save the current value in the ZVG, to the ZVG's EEPROM.
				// This allow the parameters to survive a power failure.
				// FYI: There are separate EEPROM locations for each table
				// speed.

			case 'S':
			case 's':
				zvgDmaPutc( zcSAVE_EE);
				pMsg( " Current values saved to EEPROM. ");
				clearCount = FRAMERATE * 4;				// display for 4 seconds
				break;

				// Reload the values from the EEPROM, incase you've screwed
				// something up and want to get back to where you were.

			case 'L':
			case 'l':
				zvgDmaPutc( zcLOAD_EE);
				pMsg( " Monitor values re-loaded from EEPROM. ");
				textattr( ATTR_DEF);
				clearCount = FRAMERATE * 4;				// display for 4 seconds
				paramsChanged = zTrue;						// indicate parameters need reading
				break;

				// Reset the values to the factor default, incase you've *really*
				// screwed something up!  If the values save in EEPROM are
				// screwed up you will have to save these values back to EEPROM
				// if you don't want them reappearing.

			case 'I':
			case 'i':
				zvgDmaPutc( zcRESET_MON);
				pMsg( " Monitor values initialized to factory defaults. ");
				clearCount = FRAMERATE * 4;				// display for 4 seconds
				paramsChanged = zTrue;						// indicate parameters need reading
				break;
			}

			if (cc == 0x1B || cc == 'X' || cc == 'x')
				break;							// if ESC pressed, leave loop
		} // End of check for keyboard input

		// wait for start of next frame

		tmrWaitForFrame();

		err = zvgFrameSend();				// send frame of DMA and swap buffers

		// if parameters were changed, read new parameter into parameter structure

		if (paramsChanged)
		{	zvgReadMonitorInfo( &ZvgMon);	// read info from ZVG
			paramRead();						// update our local database
			pParamAll( pIdx);					// reprint local variables
			paramsChanged = zFalse;
		}
	} // End of while loop

	// restore ZVG stuff

	zvgFrameClose();

	// set back to original video values, clear screen, turn the cursor back on

#if defined(WIN32)
#elif defined(linux)

//!!!	normvideo();
	initscr();
//!!!	_setcursortype( _NORMALCURSOR);

#else // DOS

	normvideo();
	clrscr();
	_setcursortype( _NORMALCURSOR);

#endif // OS

	// if we exited because of an error, print the error.

	if (err)
		zvgError( err);

	exitProg();
	return (0);
}